

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibMath.cpp
# Opt level: O3

int lib::math::Modf(State *state)

{
  bool bVar1;
  int iVar2;
  double dVar3;
  double ipart;
  StackAPI api;
  double local_28;
  StackAPI local_20;
  
  luna::StackAPI::StackAPI(&local_20,state);
  bVar1 = luna::StackAPI::CheckArgs<luna::ValueT>(&local_20,1,ValueT_Number);
  iVar2 = 0;
  if (bVar1) {
    local_28 = 0.0;
    dVar3 = luna::StackAPI::GetNumber(&local_20,0);
    dVar3 = modf(dVar3,&local_28);
    luna::StackAPI::PushNumber(&local_20,local_28);
    luna::StackAPI::PushNumber(&local_20,dVar3);
    iVar2 = 2;
  }
  return iVar2;
}

Assistant:

int Modf(luna::State *state)
    {
        luna::StackAPI api(state);
        if (!api.CheckArgs(1, luna::ValueT_Number))
            return 0;

        double ipart = 0.0;
        auto fpart = std::modf(api.GetNumber(0), &ipart);
        api.PushNumber(ipart);
        api.PushNumber(fpart);
        return 2;
    }